

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImVec2 * ImVector_ImVec2_ImVector_ImVec2Vector(ImVector_ImVec2 *src)

{
  uint uVar1;
  ImVector_ImVec2 *pIVar2;
  ImVec2 *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImVec2 *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImVec2 *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImVec2 *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImVec2 *)ImGui::MemAlloc(uVar3 * 8);
    if (pIVar2->Data != (ImVec2 *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 3);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 << 3);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImVec2* ImVector_ImVec2_ImVector_ImVec2Vector(const ImVector_ImVec2 src)
{
    return IM_NEW(ImVector_ImVec2)(src);
}